

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_read_pt_bitlen(lzh_stream *strm,wchar_t start,wchar_t end)

{
  lzh_dec *plVar1;
  wchar_t wVar2;
  lzh_br *br_00;
  wchar_t in_EDX;
  wchar_t in_ESI;
  lzh_stream *in_RDI;
  wchar_t d;
  wchar_t i;
  wchar_t c;
  lzh_br *br;
  lzh_dec *ds;
  uint local_34;
  wchar_t local_30;
  uint local_2c;
  
  plVar1 = in_RDI->ds;
  br_00 = &plVar1->br;
  local_30 = in_ESI;
  do {
    if (in_EDX <= local_30) {
      return local_30;
    }
    if ((((plVar1->br).cache_avail < L'\x03') &&
        (wVar2 = lzh_br_fillup(in_RDI,br_00), wVar2 == L'\0')) &&
       ((plVar1->br).cache_avail < L'\x03')) {
      return local_30;
    }
    local_2c = (uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 3U & 0x3f)) & 7;
    if (local_2c == 7) {
      if ((((plVar1->br).cache_avail < L'\r') &&
          (wVar2 = lzh_br_fillup(in_RDI,br_00), wVar2 == L'\0')) &&
         ((plVar1->br).cache_avail < L'\r')) {
        return local_30;
      }
      for (local_34 = (uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 0xdU & 0x3f))
                      & 0x1fff; (local_34 & 0x200) != 0; local_34 = local_34 << 1) {
        local_2c = local_2c + 1;
      }
      if (0x10 < (int)local_2c) {
        return L'\xffffffff';
      }
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (local_2c - 3);
    }
    else {
      (plVar1->br).cache_avail = (plVar1->br).cache_avail + L'\xfffffffd';
    }
    (plVar1->pt).bitlen[local_30] = (uchar)local_2c;
    (plVar1->pt).freq[(int)local_2c] = (plVar1->pt).freq[(int)local_2c] + L'\x01';
    local_30 = local_30 + L'\x01';
  } while( true );
}

Assistant:

static int
lzh_read_pt_bitlen(struct lzh_stream *strm, int start, int end)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br * br = &(ds->br);
	int c, i;

	for (i = start; i < end;) {
		/*
		 *  bit pattern     the number we need
		 *     000           ->  0
		 *     001           ->  1
		 *     010           ->  2
		 *     ...
		 *     110           ->  6
		 *     1110          ->  7
		 *     11110         ->  8
		 *     ...
		 *     1111111111110 ->  16
		 */
		if (!lzh_br_read_ahead(strm, br, 3))
			return (i);
		if ((c = lzh_br_bits(br, 3)) == 7) {
			int d;
			if (!lzh_br_read_ahead(strm, br, 13))
				return (i);
			d = lzh_br_bits(br, 13);
			while (d & 0x200) {
				c++;
				d <<= 1;
			}
			if (c > 16)
				return (-1);/* Invalid data. */
			lzh_br_consume(br, c - 3);
		} else
			lzh_br_consume(br, 3);
		ds->pt.bitlen[i++] = c;
		ds->pt.freq[c]++;
	}
	return (i);
}